

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O0

unsigned_short * __thiscall
kj::_::NullableValue<unsigned_short>::emplace<unsigned_long_long>
          (NullableValue<unsigned_short> *this,unsigned_long_long *params)

{
  unsigned_long_long *params_00;
  unsigned_long_long *params_local;
  NullableValue<unsigned_short> *this_local;
  
  if ((this->isSet & 1U) != 0) {
    this->isSet = false;
    dtor<unsigned_short>(&(this->field_1).value);
  }
  params_00 = fwd<unsigned_long_long>(params);
  ctor<unsigned_short,unsigned_long_long>(&(this->field_1).value,params_00);
  this->isSet = true;
  return (unsigned_short *)&this->field_1;
}

Assistant:

inline T& emplace(Params&&... params) {
    if (isSet) {
      isSet = false;
      dtor(value);
    }
    ctor(value, kj::fwd<Params>(params)...);
    isSet = true;
    return value;
  }